

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O1

pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
* __thiscall
jessilib::
word_split_once<std::vector<char8_t,std::allocator<char8_t>>,__gnu_cxx::__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>,__gnu_cxx::__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>,char8_t>
          (pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> begin,
          __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> end,
          char8_t in_whitespace)

{
  jessilib jVar1;
  __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> _Var2;
  pointer pcVar3;
  pointer pcVar4;
  __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> __last;
  allocator_type local_79;
  pointer local_78;
  pointer pcStack_70;
  pointer pcStack_68;
  pointer local_58;
  pointer pcStack_50;
  pointer local_48;
  pointer pcStack_40;
  pointer local_38;
  pointer pcStack_30;
  
  local_38 = (pointer)0x0;
  pcStack_30 = (pointer)0x0;
  local_48 = (pointer)0x0;
  pcStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pcStack_50 = (pointer)0x0;
  if (this < begin._M_current) {
    jVar1 = SUB81(end._M_current,0);
    do {
      __last._M_current = (char8_t *)this;
      _Var2._M_current = (char8_t *)this;
      if (*this != jVar1) break;
      this = this + 1;
      __last._M_current = begin._M_current;
      _Var2._M_current = begin._M_current;
    } while (this != (jessilib *)begin._M_current);
    do {
      if (__last._M_current == begin._M_current) goto LAB_00404872;
      if ((jessilib)*__last._M_current == jVar1) {
        std::vector<char8_t,std::allocator<char8_t>>::
        vector<__gnu_cxx::__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>,void>
                  ((vector<char8_t,std::allocator<char8_t>> *)&local_78,_Var2,__last,&local_79);
        pcVar3 = local_48;
        pcVar4 = local_58;
        local_58 = local_78;
        pcStack_50 = pcStack_70;
        local_48 = pcStack_68;
        local_78 = (pointer)0x0;
        pcStack_70 = (pointer)0x0;
        pcStack_68 = (pointer)0x0;
        if (pcVar4 != (pointer)0x0) {
          operator_delete(pcVar4,(long)pcVar3 - (long)pcVar4);
        }
        if (local_78 != (pointer)0x0) {
          operator_delete(local_78,(long)pcStack_68 - (long)local_78);
        }
        goto LAB_00404930;
      }
      __last._M_current = __last._M_current + 1;
    } while( true );
  }
  (__return_storage_ptr__->first).super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  goto LAB_004049cd;
LAB_00404872:
  std::vector<char8_t,std::allocator<char8_t>>::
  vector<__gnu_cxx::__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>,void>
            ((vector<char8_t,std::allocator<char8_t>> *)&local_78,_Var2,begin,&local_79);
  pcVar3 = local_48;
  pcVar4 = local_58;
  local_58 = local_78;
  pcStack_50 = pcStack_70;
  local_48 = pcStack_68;
  goto LAB_00404979;
  while (_Var2._M_current = __last._M_current, (jessilib)*__last._M_current == jVar1) {
LAB_00404930:
    __last._M_current = __last._M_current + 1;
    _Var2._M_current = begin._M_current;
    if (__last._M_current == begin._M_current) break;
  }
  std::vector<char8_t,std::allocator<char8_t>>::
  vector<__gnu_cxx::__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>,void>
            ((vector<char8_t,std::allocator<char8_t>> *)&local_78,_Var2,begin,&local_79);
  pcVar3 = pcStack_30;
  pcVar4 = pcStack_40;
  pcStack_40 = local_78;
  local_38 = pcStack_70;
  pcStack_30 = pcStack_68;
LAB_00404979:
  local_78 = (pointer)0x0;
  pcStack_70 = (pointer)0x0;
  pcStack_68 = (pointer)0x0;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4,(long)pcVar3 - (long)pcVar4);
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78,(long)pcStack_68 - (long)local_78);
  }
  (__return_storage_ptr__->first).super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
  super__Vector_impl_data._M_start = local_58;
  (__return_storage_ptr__->first).super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
  super__Vector_impl_data._M_finish = pcStack_50;
  (__return_storage_ptr__->first).super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_48;
LAB_004049cd:
  (__return_storage_ptr__->second).super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
  super__Vector_impl_data._M_start = pcStack_40;
  (__return_storage_ptr__->second).super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
  super__Vector_impl_data._M_finish = local_38;
  (__return_storage_ptr__->second).super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pcStack_30;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}